

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-opengl.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWwindow *handle;
  float *pfVar6;
  uint *puVar7;
  int i;
  long lVar8;
  int r;
  long lVar9;
  long lVar10;
  float fVar11;
  int iVar12;
  float fVar13;
  int iVar15;
  double dVar14;
  int height;
  int width;
  GLuint vertex_array;
  GLuint vertex_buffer;
  mat4x4 temp;
  mat4x4 mvp;
  mat4x4 m;
  int local_174;
  int local_170;
  GLuint local_16c;
  float local_168;
  undefined1 local_164 [16];
  float local_154;
  undefined1 auStack_150 [12];
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined1 local_13c [16];
  undefined4 local_12c;
  GLuint local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"OpenGL Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      (*glad_glGenBuffers)(1,&local_11c);
      (*glad_glBindBuffer)(0x8892,local_11c);
      (*glad_glBufferData)(0x8892,0x3c,vertices,0x88e4);
      GVar2 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar2);
      GVar3 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar4,GVar2);
      (*glad_glAttachShader)(GVar4,GVar3);
      (*glad_glLinkProgram)(GVar4);
      GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
      GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
      GVar3 = (*glad_glGetAttribLocation)(GVar4,"vCol");
      (*glad_glGenVertexArrays)(1,&local_16c);
      (*glad_glBindVertexArray)(local_16c);
      (*glad_glEnableVertexAttribArray)(GVar2);
      (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',0x14,(void *)0x0);
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,3,0x1406,'\0',0x14,(void *)0x8);
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 == 0) {
        do {
          glfwGetFramebufferSize(handle,&local_170,&local_174);
          iVar1 = local_170;
          fVar11 = (float)local_174;
          (*glad_glViewport)(0,0,local_170,local_174);
          (*glad_glClear)(0x4000);
          lVar8 = 0;
          puVar7 = (uint *)&local_78;
          do {
            iVar12 = (int)lVar8;
            iVar15 = (int)((ulong)lVar8 >> 0x20);
            *puVar7 = -(uint)(iVar12 == 0 && iVar15 == 0) & 0x3f800000;
            puVar7[1] = -(uint)(iVar12 == 1 && iVar15 == 0) & 0x3f800000;
            puVar7[2] = -(uint)(iVar12 == 2 && iVar15 == 0) & 0x3f800000;
            puVar7[3] = -(uint)(iVar15 == 0 && iVar12 == 3) & 0x3f800000;
            lVar8 = lVar8 + 1;
            puVar7 = puVar7 + 4;
          } while (lVar8 != 4);
          local_c8 = ZEXT416((uint)(float)iVar1);
          dVar14 = glfwGetTime();
          local_d8 = sinf((float)dVar14);
          local_168 = cosf((float)dVar14);
          local_164._4_8_ = 0;
          local_164._0_4_ = local_d8;
          local_164._12_4_ = -local_d8;
          local_154 = local_168;
          local_13c._0_12_ = ZEXT812(0);
          local_13c._12_4_ = 0;
          auStack_150 = local_13c._0_12_;
          uStack_144 = 0;
          uStack_140 = 0x3f800000;
          local_12c = 0x3f800000;
          lVar8 = 0;
          pfVar6 = &local_168;
          do {
            lVar9 = 0;
            puVar7 = (uint *)&local_78;
            do {
              fVar13 = 0.0;
              lVar10 = 0;
              do {
                fVar13 = fVar13 + (float)puVar7[lVar10] * *(float *)((long)pfVar6 + lVar10);
                lVar10 = lVar10 + 4;
              } while (lVar10 != 0x10);
              *(float *)((long)&local_118 + lVar9 * 4 + lVar8 * 0x10) = fVar13;
              lVar9 = lVar9 + 1;
              puVar7 = puVar7 + 1;
            } while (lVar9 != 4);
            lVar8 = lVar8 + 1;
            pfVar6 = pfVar6 + 4;
          } while (lVar8 != 4);
          fVar11 = (float)local_c8._0_4_ / fVar11;
          local_48 = local_e8;
          uStack_40 = uStack_e0;
          local_58 = local_f8;
          uStack_50 = uStack_f0;
          local_68 = local_108;
          uStack_60 = uStack_100;
          local_78 = local_118;
          uStack_70 = uStack_110;
          local_168 = 2.0 / (fVar11 + fVar11);
          local_164 = (undefined1  [16])0x0;
          uStack_144 = 0;
          uStack_140 = 0x3f800000;
          local_154 = SUB124(ZEXT812(0x3f800000),0);
          auStack_150._8_4_ = 0;
          auStack_150._0_8_ = SUB128(ZEXT812(0x3f800000),4);
          local_13c._0_8_ = (ulong)(uint)(-(fVar11 - fVar11) / (fVar11 + fVar11)) << 0x20;
          local_13c._8_8_ = 0x80000000;
          local_12c = 0x3f800000;
          lVar8 = 0;
          puVar7 = (uint *)&local_78;
          do {
            lVar9 = 0;
            pfVar6 = &local_168;
            do {
              fVar11 = 0.0;
              lVar10 = 0;
              do {
                fVar11 = fVar11 + pfVar6[lVar10] * *(float *)((long)puVar7 + lVar10);
                lVar10 = lVar10 + 4;
              } while (lVar10 != 0x10);
              *(float *)((long)&local_118 + lVar9 * 4 + lVar8 * 0x10) = fVar11;
              lVar9 = lVar9 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar9 != 4);
            lVar8 = lVar8 + 1;
            puVar7 = puVar7 + 4;
          } while (lVar8 != 4);
          local_88 = local_e8;
          uStack_80 = uStack_e0;
          local_98 = local_f8;
          uStack_90 = uStack_f0;
          local_a8 = local_108;
          uStack_a0 = uStack_100;
          local_b8 = local_118;
          uStack_b0 = uStack_110;
          (*glad_glUseProgram)(GVar4);
          (*glad_glUniformMatrix4fv)(GVar5,1,'\0',(GLfloat *)&local_b8);
          (*glad_glBindVertexArray)(local_16c);
          (*glad_glDrawArrays)(4,0,3);
          glfwSwapBuffers(handle);
          glfwPollEvents();
          iVar1 = glfwWindowShouldClose(handle);
        } while (iVar1 == 0);
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(640, 480, "OpenGL Triangle", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    // NOTE: OpenGL error checks have been omitted for brevity

    GLuint vertex_buffer;
    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    const GLuint vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    const GLuint fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    const GLuint program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    const GLint mvp_location = glGetUniformLocation(program, "MVP");
    const GLint vpos_location = glGetAttribLocation(program, "vPos");
    const GLint vcol_location = glGetAttribLocation(program, "vCol");

    GLuint vertex_array;
    glGenVertexArrays(1, &vertex_array);
    glBindVertexArray(vertex_array);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, pos));
    glEnableVertexAttribArray(vcol_location);
    glVertexAttribPointer(vcol_location, 3, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, col));

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        glfwGetFramebufferSize(window, &width, &height);
        const float ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4 m, p, mvp;
        mat4x4_identity(m);
        mat4x4_rotate_Z(m, m, (float) glfwGetTime());
        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) &mvp);
        glBindVertexArray(vertex_array);
        glDrawArrays(GL_TRIANGLES, 0, 3);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}